

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O1

void uECC_decompress(uint8_t *compressed,uint8_t *public_key)

{
  uECC_word_t *result;
  uECC_word_t uVar1;
  uint uVar2;
  long lVar3;
  uECC_word_t carry;
  swordcount_t i;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uECC_word_t local_108;
  uECC_word_t product [8];
  EccPoint point;
  uECC_word_t l_result [4];
  uECC_word_t p1 [4];
  
  vli_bytesToNative(product + 7,compressed + 1);
  curve_x_side(point.x + 3,product + 7);
  l_result[3] = 1;
  l_result[1] = 0;
  l_result[2] = 0;
  point.y[3] = 1;
  l_result[0] = 0;
  lVar3 = 0;
  uVar5 = 0;
  do {
    uVar7 = *(ulong *)((long)curve_p + lVar3);
    uVar6 = uVar7 + uVar5 + *(long *)((long)l_result + lVar3 + 0x18);
    if (uVar6 != uVar7) {
      uVar5 = (ulong)(uVar6 < uVar7);
    }
    *(ulong *)((long)l_result + lVar3 + 0x18) = uVar6;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x20);
  uVar5 = 3;
  do {
    uVar2 = (uint)uVar5;
    if (l_result[uVar5 + 3] != 0) goto LAB_00118268;
    uVar5 = (ulong)(uVar2 - 1);
  } while (uVar2 != 0);
  uVar2 = 0xffffffff;
LAB_00118268:
  if (uVar2 == 0xffffffff) {
    iVar4 = 0;
  }
  else {
    uVar5 = l_result[(ulong)uVar2 + 3];
    lVar3 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    iVar4 = 0;
    if (uVar5 != 0) {
      iVar4 = ((uint)lVar3 ^ 0xffffffc0) + 0x41;
    }
    iVar4 = uVar2 * 0x40 + iVar4;
  }
  if (2 < iVar4) {
    iVar4 = iVar4 + 1;
    result = point.y + 3;
    do {
      vli_modSquare_fast(result,result);
      if ((l_result[(long)((int)(iVar4 - 2U) >> 6) + 3] >> ((ulong)(iVar4 - 2U) & 0x3f) & 1) != 0) {
        vli_mult(&local_108,result,point.x + 3);
        vli_mmod_fast(result,&local_108);
      }
      iVar4 = iVar4 + -1;
    } while (3 < iVar4);
  }
  point.y[1] = l_result[1];
  point.y[2] = l_result[2];
  point.x[3] = point.y[3];
  uVar1 = point.x[3];
  point.y[0] = l_result[0];
  point.x[3]._0_4_ = (uint)point.y[3];
  uVar2 = (uint)point.x[3] & 1;
  point.x[3] = uVar1;
  if (uVar2 != (*compressed & 1)) {
    lVar3 = 0;
    uVar5 = 0;
    do {
      uVar7 = *(long *)((long)point.x + lVar3 + 0x18) + uVar5;
      if (uVar7 != 0) {
        uVar5 = (ulong)(*(ulong *)((long)curve_p + lVar3) < uVar7);
      }
      *(ulong *)((long)point.x + lVar3 + 0x18) = *(ulong *)((long)curve_p + lVar3) - uVar7;
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x20);
  }
  vli_nativeToBytes(public_key,product + 7);
  vli_nativeToBytes(public_key + 0x20,point.x + 3);
  return;
}

Assistant:

void uECC_decompress(const uint8_t compressed[uECC_BYTES+1], uint8_t public_key[uECC_BYTES*2]) {
    EccPoint point;
    vli_bytesToNative(point.x, compressed + 1);
    curve_x_side(point.y, point.x);
    mod_sqrt(point.y);

    if ((point.y[0] & 0x01) != (compressed[0] & 0x01)) {
        vli_sub(point.y, curve_p, point.y);
    }

    vli_nativeToBytes(public_key, point.x);
    vli_nativeToBytes(public_key + uECC_BYTES, point.y);
}